

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

char * parse_identifier(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_t token_02;
  char *pcVar1;
  char *pcVar2;
  gravity_parser_t *parser_00;
  undefined8 in_R8;
  undefined8 in_R9;
  gtoken_s token;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  uint32_t uStack_30;
  uint32_t uStack_2c;
  char *local_28;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  token_02 = gravity_lexer_peek(lexer);
  if (token_02 == TOK_IDENTIFIER) {
    gravity_lexer_next(lexer);
    parser_00 = (gravity_parser_t *)&token;
    gravity_lexer_token(lexer);
    token_00.colno = token.colno;
    token_00.type = token.type;
    token_00.lineno = token.lineno;
    token_00.position = token.position;
    token_00.bytes = token.bytes;
    token_00.length = token.length;
    token_00.fileid = token.fileid;
    token_00.builtin = token.builtin;
    token_00.value = token.value;
    pcVar1 = cstring_from_token(parser_00,token_00);
  }
  else if (token_02 == TOK_ERROR) {
    parse_error(parser);
    pcVar1 = (char *)0x0;
  }
  else {
    gravity_lexer_token(lexer);
    pcVar2 = token_name(token_02);
    pcVar1 = (char *)0x0;
    token_01.lineno = uStack_44;
    token_01.type = local_48;
    token_01.colno = uStack_40;
    token_01.position = uStack_3c;
    token_01.bytes = local_38;
    token_01.length = uStack_34;
    token_01.fileid = uStack_30;
    token_01.builtin = uStack_2c;
    token_01.value = local_28;
    report_error(parser,GRAVITY_ERROR_SYNTAX,token_01,"Expected identifier but found %s",pcVar2,
                 in_R8,in_R9);
  }
  return pcVar1;
}

Assistant:

static const char *parse_identifier (gravity_parser_t *parser) {
    DECLARE_LEXER;

    // parse IDENTIFIER is always mandatory
    gtoken_t type = gravity_lexer_peek(lexer);
    if (type != TOK_IDENTIFIER) {
        if (type == TOK_ERROR) parse_error(parser);
        else REPORT_ERROR(gravity_lexer_token(lexer), "Expected identifier but found %s", token_name(type));
        return NULL;
    }

    gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    const char *identifier = cstring_from_token(parser, token);
    return identifier;
}